

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O3

void __thiscall MethodInfo::Print(MethodInfo *this,ofstream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"name: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"returnType: ",0xc);
    TypeInfo::Print((this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"isPublic: ",10);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(out,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"arguments: {",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  VariablesInfo::Print
            ((this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"} ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"fields: {",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  VariablesInfo::Print
            ((this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,out
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"} ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  return;
}

Assistant:

void MethodInfo::Print( std::ofstream& out )
{
	out << "\t" << "\t" << "name: " << name << " " << "\n";
	if( returnType ) {
		out << "\t" << "\t" << "returnType: ";
		returnType->Print( out ); 
		out << "\n";
	}
	out << "\t" << "\t" << "isPublic: " << isPublic << " " << "\n";
	out << "\t" << "\t" << "arguments: {" << "\n";
	arguments->Print( out );
	out << "\t" << "\t" << "} " << "\n";
	out << "\t" << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "\t" << "} " << "\n";
}